

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_cipher_suite_t * find_aes128gcmsha256(ptls_context_t *ctx)

{
  ptls_cipher_suite_t **local_18;
  ptls_cipher_suite_t **cs;
  ptls_context_t *ctx_local;
  
  local_18 = ctx->cipher_suites;
  while( true ) {
    if (*local_18 == (ptls_cipher_suite_t *)0x0) {
      __assert_fail("!\"FIXME\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x25,"ptls_cipher_suite_t *find_aes128gcmsha256(ptls_context_t *)");
    }
    if ((*local_18)->id == 0x1301) break;
    local_18 = local_18 + 1;
  }
  return *local_18;
}

Assistant:

static ptls_cipher_suite_t *find_aes128gcmsha256(ptls_context_t *ctx)
{
    ptls_cipher_suite_t **cs;
    for (cs = ctx->cipher_suites; *cs != NULL; ++cs)
        if ((*cs)->id == PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)
            return *cs;
    assert(!"FIXME");
}